

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

char * uv_strerror(int err)

{
  char *pcStack_10;
  int err_local;
  
  if (err == -0xfff) {
    pcStack_10 = "end of file";
  }
  else if (err == -0xffe) {
    pcStack_10 = "unknown error";
  }
  else if (err == -0xff0) {
    pcStack_10 = "invalid Unicode character";
  }
  else if (err == -0xbc6) {
    pcStack_10 = "resolved protocol is unknown";
  }
  else if (err == -0xbc5) {
    pcStack_10 = "invalid value for hints";
  }
  else if (err == -0xbc3) {
    pcStack_10 = "socket type not supported";
  }
  else if (err == -0xbc2) {
    pcStack_10 = "service not available for socket type";
  }
  else if (err == -0xbc1) {
    pcStack_10 = "argument buffer overflow";
  }
  else if (err == -0xbc0) {
    pcStack_10 = "unknown node or service";
  }
  else if (err == -0xbbf) {
    pcStack_10 = "no address";
  }
  else if (err == -0xbbe) {
    pcStack_10 = "out of memory";
  }
  else if (err == -0xbbd) {
    pcStack_10 = "ai_family not supported";
  }
  else if (err == -0xbbc) {
    pcStack_10 = "permanent failure";
  }
  else if (err == -0xbbb) {
    pcStack_10 = "request canceled";
  }
  else if (err == -0xbba) {
    pcStack_10 = "bad ai_flags value";
  }
  else if (err == -0xbb9) {
    pcStack_10 = "temporary failure";
  }
  else if (err == -3000) {
    pcStack_10 = "address family not supported";
  }
  else if (err == -0x7d) {
    pcStack_10 = "operation canceled";
  }
  else if (err == -0x72) {
    pcStack_10 = "connection already in progress";
  }
  else if (err == -0x71) {
    pcStack_10 = "host is unreachable";
  }
  else if (err == -0x70) {
    pcStack_10 = "host is down";
  }
  else if (err == -0x6f) {
    pcStack_10 = "connection refused";
  }
  else if (err == -0x6e) {
    pcStack_10 = "connection timed out";
  }
  else if (err == -0x6c) {
    pcStack_10 = "cannot send after transport endpoint shutdown";
  }
  else if (err == -0x6b) {
    pcStack_10 = "socket is not connected";
  }
  else if (err == -0x6a) {
    pcStack_10 = "socket is already connected";
  }
  else if (err == -0x69) {
    pcStack_10 = "no buffer space available";
  }
  else if (err == -0x68) {
    pcStack_10 = "connection reset by peer";
  }
  else if (err == -0x67) {
    pcStack_10 = "software caused connection abort";
  }
  else if (err == -0x65) {
    pcStack_10 = "network is unreachable";
  }
  else if (err == -100) {
    pcStack_10 = "network is down";
  }
  else if (err == -99) {
    pcStack_10 = "address not available";
  }
  else if (err == -0x62) {
    pcStack_10 = "address already in use";
  }
  else if (err == -0x61) {
    pcStack_10 = "address family not supported";
  }
  else if (err == -0x5f) {
    pcStack_10 = "operation not supported on socket";
  }
  else if (err == -0x5d) {
    pcStack_10 = "protocol not supported";
  }
  else if (err == -0x5c) {
    pcStack_10 = "protocol not available";
  }
  else if (err == -0x5b) {
    pcStack_10 = "protocol wrong type for socket";
  }
  else if (err == -0x5a) {
    pcStack_10 = "message too long";
  }
  else if (err == -0x59) {
    pcStack_10 = "destination address required";
  }
  else if (err == -0x58) {
    pcStack_10 = "socket operation on non-socket";
  }
  else if (err == -0x47) {
    pcStack_10 = "protocol error";
  }
  else if (err == -0x40) {
    pcStack_10 = "machine is not on the network";
  }
  else if (err == -0x28) {
    pcStack_10 = "too many symbolic links encountered";
  }
  else if (err == -0x27) {
    pcStack_10 = "directory not empty";
  }
  else if (err == -0x26) {
    pcStack_10 = "function not implemented";
  }
  else if (err == -0x24) {
    pcStack_10 = "name too long";
  }
  else if (err == -0x22) {
    pcStack_10 = "result too large";
  }
  else if (err == -0x20) {
    pcStack_10 = "broken pipe";
  }
  else if (err == -0x1f) {
    pcStack_10 = "too many links";
  }
  else if (err == -0x1e) {
    pcStack_10 = "read-only file system";
  }
  else if (err == -0x1d) {
    pcStack_10 = "invalid seek";
  }
  else if (err == -0x1c) {
    pcStack_10 = "no space left on device";
  }
  else if (err == -0x1b) {
    pcStack_10 = "file too large";
  }
  else if (err == -0x1a) {
    pcStack_10 = "text file is busy";
  }
  else if (err == -0x18) {
    pcStack_10 = "too many open files";
  }
  else if (err == -0x17) {
    pcStack_10 = "file table overflow";
  }
  else if (err == -0x16) {
    pcStack_10 = "invalid argument";
  }
  else if (err == -0x15) {
    pcStack_10 = "illegal operation on a directory";
  }
  else if (err == -0x14) {
    pcStack_10 = "not a directory";
  }
  else if (err == -0x13) {
    pcStack_10 = "no such device";
  }
  else if (err == -0x12) {
    pcStack_10 = "cross-device link not permitted";
  }
  else if (err == -0x11) {
    pcStack_10 = "file already exists";
  }
  else if (err == -0x10) {
    pcStack_10 = "resource busy or locked";
  }
  else if (err == -0xe) {
    pcStack_10 = "bad address in system call argument";
  }
  else if (err == -0xd) {
    pcStack_10 = "permission denied";
  }
  else if (err == -0xc) {
    pcStack_10 = "not enough memory";
  }
  else if (err == -0xb) {
    pcStack_10 = "resource temporarily unavailable";
  }
  else if (err == -9) {
    pcStack_10 = "bad file descriptor";
  }
  else if (err == -7) {
    pcStack_10 = "argument list too long";
  }
  else if (err == -6) {
    pcStack_10 = "no such device or address";
  }
  else if (err == -5) {
    pcStack_10 = "i/o error";
  }
  else if (err == -4) {
    pcStack_10 = "interrupted system call";
  }
  else if (err == -3) {
    pcStack_10 = "no such process";
  }
  else if (err == -2) {
    pcStack_10 = "no such file or directory";
  }
  else if (err == -1) {
    pcStack_10 = "operation not permitted";
  }
  else {
    pcStack_10 = uv__unknown_err_code(err);
  }
  return pcStack_10;
}

Assistant:

const char* uv_strerror(int err) {
  switch (err) {
    UV_ERRNO_MAP(UV_STRERROR_GEN)
  }
  return uv__unknown_err_code(err);
}